

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_list(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _outlet *p_Var2;
  t_atom *to;
  t_atom *ptVar3;
  size_t nbytes;
  long lVar4;
  int argc_00;
  ulong uVar5;
  undefined1 local_58 [8];
  t_alist y;
  
  ptVar3 = (t_atom *)local_58;
  lVar4 = (long)argc;
  uVar5 = (x->x_alist).l_n + lVar4;
  argc_00 = (int)uVar5;
  y.l_vec = (t_listelem *)(uVar5 & 0xffffffff);
  if (argc_00 < 100) {
    ptVar3 = (t_atom *)(local_58 + uVar5 * -0x10);
    to = ptVar3;
  }
  else {
    to = (t_atom *)getbytes((long)y.l_vec << 4);
  }
  ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cbdb;
  atoms_copy(argc,argv,to);
  if ((x->x_alist).l_npointer == 0) {
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc4e;
    alist_toatoms(&x->x_alist,to + lVar4,0,iVar1);
    p_Var2 = x->x_out1;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc65;
    outlet_list(p_Var2,&s_list,argc_00,to);
  }
  else {
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cbfa;
    alist_clone(&x->x_alist,(t_alist *)local_58,0,iVar1);
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc13;
    alist_toatoms((t_alist *)local_58,to + lVar4,0,iVar1);
    p_Var2 = x->x_out1;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc2a;
    outlet_list(p_Var2,&s_list,argc_00,to);
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc32;
    alist_clear((t_alist *)local_58);
  }
  if (99 < argc_00) {
    nbytes = (long)y.l_vec << 4;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x17cc7b;
    freebytes(to,nbytes);
  }
  return;
}

Assistant:

static void list_store_list(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    int n, outc = x->x_alist.l_n + argc;
    ATOMS_ALLOCA(outv, outc);
    atoms_copy(argc, argv, outv);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, x->x_alist.l_n);
        alist_toatoms(&y, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}